

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O2

void quit_altrace_playback(void)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  
  iVar2 = logfd;
  logfd = -1;
  next_mapped_threadid = 0;
  trace_scope = 0;
  guserdata = (void *)0x0;
  io_failure = 0;
  fflush(_stdout);
  if (iVar2 != -1) {
    iVar2 = close(iVar2);
    __stream = _stderr;
    pcVar1 = GAppName;
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"%s: Failed to close OpenAL log file: %s\n",pcVar1,pcVar4);
    }
  }
  free_device_map();
  free_context_map();
  free_source_map();
  free_buffer_map();
  free_stackframe_map();
  free_threadid_map();
  free_devicelabel_map();
  free_contextlabel_map();
  free_sourcelabel_map();
  free_bufferlabel_map();
  free_ioblobs();
  fflush(_stderr);
  return;
}

Assistant:

static void quit_altrace_playback(void)
{
    const int io = logfd;

    logfd = -1;
    io_failure = 0;
    next_mapped_threadid = 0;
    trace_scope = 0;
    guserdata = NULL;

    fflush(stdout);

    if ((io != -1) && (close(io) < 0)) {
        fprintf(stderr, "%s: Failed to close OpenAL log file: %s\n", GAppName, strerror(errno));
    }

    free_device_map();
    free_context_map();
    free_source_map();
    free_buffer_map();
    free_stackframe_map();
    free_threadid_map();
    free_devicelabel_map();
    free_contextlabel_map();
    free_sourcelabel_map();
    free_bufferlabel_map();
    free_ioblobs();

    fflush(stderr);
}